

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressBegin_usingCDict_advanced
                 (ZSTD_CCtx *cctx,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_CCtx_params params_00;
  U32 UVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  ZSTD_CDict *in_RSI;
  long in_RDI;
  ZSTD_CDict *in_R8;
  U32 limitedSrcLog;
  U32 limitedSrcSize;
  ZSTD_CCtx_params params;
  undefined8 local_188 [16];
  undefined4 local_108;
  undefined1 *local_f8;
  ZSTD_dictContentType_e local_f0;
  ZSTD_dictContentType_e local_ec;
  ZSTD_CDict *in_stack_ffffffffffffff18;
  ZSTD_dictTableLoadMethod_e in_stack_ffffffffffffff20;
  ZSTD_dictContentType_e in_stack_ffffffffffffff24;
  uint in_stack_ffffffffffffff28;
  ZSTD_dictContentType_e in_stack_ffffffffffffff2c;
  uint in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  uint in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  uint uStack_c0;
  ZSTD_strategy local_bc;
  undefined4 local_b8;
  ZSTD_dictContentType_e ZStack_b4;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff74;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  ZSTD_buffered_policy_e zbuff;
  size_t local_8;
  
  if (in_RSI == (ZSTD_CDict *)0x0) {
    local_8 = 0xffffffffffffffe0;
  }
  else {
    memcpy(&local_b8,(void *)(in_RDI + 0x10),0x78);
    zbuff = (ZSTD_buffered_policy_e)in_RDI;
    ZSTD_getCParamsFromCDict((ZSTD_compressionParameters *)&stack0xffffffffffffff2c,in_RSI);
    ZStack_b4 = in_stack_ffffffffffffff2c;
    uVar2 = in_stack_ffffffffffffff30;
    uVar3 = in_stack_ffffffffffffff34;
    uVar4 = in_stack_ffffffffffffff38;
    uVar5 = in_stack_ffffffffffffff3c;
    if (in_R8 != (ZSTD_CDict *)0xffffffffffffffff) {
      in_stack_ffffffffffffff18 = in_R8;
      if ((ZSTD_CDict *)0x7ffff < in_R8) {
        in_stack_ffffffffffffff18 = (ZSTD_CDict *)0x80000;
      }
      in_stack_ffffffffffffff28 = (uint)in_stack_ffffffffffffff18;
      if (in_stack_ffffffffffffff28 < 2) {
        local_ec = ZSTD_dct_rawContent;
      }
      else {
        UVar1 = ZSTD_highbit32(in_stack_ffffffffffffff28 - 1);
        local_ec = UVar1 + ZSTD_dct_rawContent;
      }
      if (local_ec < ZStack_b4) {
        local_f0 = ZStack_b4;
      }
      else {
        local_f0 = local_ec;
      }
      ZStack_b4 = local_f0;
      in_stack_ffffffffffffff24 = local_ec;
    }
    local_188[0] = CONCAT44(ZStack_b4,local_b8);
    local_108 = 0;
    params_00.cParams.windowLog = uVar3;
    params_00.format = uVar2;
    params_00.cParams.chainLog = uVar4;
    params_00.cParams.hashLog = uVar5;
    params_00.cParams.searchLog = uStack_c0;
    params_00.cParams.searchLength = local_bc;
    params_00.cParams._20_8_ = in_RDX;
    params_00.fParams.contentSizeFlag = in_ECX;
    params_00.fParams.checksumFlag = in_stack_ffffffffffffff74;
    params_00.fParams.noDictIDFlag = (int)in_stack_ffffffffffffff78;
    params_00.compressionLevel = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    params_00.disableLiteralCompression = (int)in_stack_ffffffffffffff80;
    params_00.forceWindow = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    params_00.nbWorkers = (int)in_stack_ffffffffffffff88;
    params_00.jobSize = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    params_00.overlapSizeLog = (int)in_stack_ffffffffffffff90;
    params_00.ldmParams.enableLdm = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
    params_00.ldmParams.hashLog = (int)in_stack_ffffffffffffff98;
    params_00.ldmParams.bucketSizeLog = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    params_00.ldmParams.minMatchLength = (int)in_stack_ffffffffffffffa0;
    params_00.ldmParams.hashEveryLog = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
    params_00._88_8_ = in_stack_ffffffffffffffa8;
    params_00.customMem.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffb0;
    params_00.customMem.customFree = (ZSTD_freeFunction)in_stack_ffffffffffffffb8;
    params_00.customMem.opaque = in_R8;
    local_f8 = (undefined1 *)local_188;
    local_8 = ZSTD_compressBegin_internal
                        ((ZSTD_CCtx *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                         (void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,
                         in_stack_ffffffffffffff18,params_00,(U64)in_RSI,zbuff);
  }
  return local_8;
}

Assistant:

size_t ZSTD_compressBegin_usingCDict_advanced(
    ZSTD_CCtx* const cctx, const ZSTD_CDict* const cdict,
    ZSTD_frameParameters const fParams, unsigned long long const pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_compressBegin_usingCDict_advanced");
    if (cdict==NULL) return ERROR(dictionary_wrong);
    {   ZSTD_CCtx_params params = cctx->requestedParams;
        params.cParams = ZSTD_getCParamsFromCDict(cdict);
        /* Increase window log to fit the entire dictionary and source if the
         * source size is known. Limit the increase to 19, which is the
         * window log for compression level 1 with the largest source size.
         */
        if (pledgedSrcSize != ZSTD_CONTENTSIZE_UNKNOWN) {
            U32 const limitedSrcSize = (U32)MIN(pledgedSrcSize, 1U << 19);
            U32 const limitedSrcLog = limitedSrcSize > 1 ? ZSTD_highbit32(limitedSrcSize - 1) + 1 : 1;
            params.cParams.windowLog = MAX(params.cParams.windowLog, limitedSrcLog);
        }
        params.fParams = fParams;
        return ZSTD_compressBegin_internal(cctx,
                                           NULL, 0, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                           cdict,
                                           params, pledgedSrcSize,
                                           ZSTDb_not_buffered);
    }
}